

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlRotateLeft(NodeAVL *q)

{
  NodeAVL *nd;
  NodeAVL *pNVar1;
  
  nd = q->right;
  pNVar1 = nd->left;
  q->right = pNVar1;
  if (pNVar1 != (NodeAVL *)0x0) {
    pNVar1->parent = q;
  }
  nd->left = q;
  pNVar1 = q->parent;
  q->parent = nd;
  nd->parent = pNVar1;
  avlFixHeight(q);
  avlFixHeight(nd);
  return nd;
}

Assistant:

static
NodeAVL* avlRotateLeft( NodeAVL* q ){
    #ifdef DEBUG_AVL
      printf( "avlRotateLeft id=%d\n", q->id );
    #endif
    NodeAVL* p = q->right;
    q->right = p->left;
    if( p->left ) p->left->parent = q;
    p->left = q;
    NodeAVL* qp = q->parent;
    q->parent = p;
    p->parent = qp;
    avlFixHeight(q);
    avlFixHeight(p);
    return p;
}